

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

bool __thiscall
moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
ExplicitProducer::new_block_index(ExplicitProducer *this,size_t numberOfFilledSlotsToExpose)

{
  ulong uVar1;
  size_t sVar2;
  BlockIndexEntry *pBVar3;
  Block *pBVar4;
  __pointer_type pBVar5;
  BlockIndexEntry *pBVar6;
  size_t sVar7;
  ulong uVar8;
  BlockIndexEntry *pBVar9;
  
  uVar1 = this->pr_blockIndexSize;
  this->pr_blockIndexSize = uVar1 * 2;
  pBVar5 = (__pointer_type)malloc(uVar1 * 0x20 + 0x27);
  if (pBVar5 == (__pointer_type)0x0) {
    this->pr_blockIndexSize = uVar1 & 0x7fffffffffffffff;
  }
  else {
    pBVar6 = (BlockIndexEntry *)((long)&pBVar5[1].size + (ulong)(-((int)pBVar5 + 0x20) & 7));
    if (this->pr_blockIndexSlotsUsed == 0) {
      sVar7 = 0;
    }
    else {
      sVar2 = this->pr_blockIndexFront;
      pBVar3 = this->pr_blockIndexEntries;
      uVar8 = sVar2 - this->pr_blockIndexSlotsUsed & uVar1 - 1;
      sVar7 = 0;
      pBVar9 = pBVar6;
      do {
        sVar7 = sVar7 + 1;
        pBVar4 = pBVar3[uVar8].block;
        pBVar9->base = pBVar3[uVar8].base;
        pBVar9->block = pBVar4;
        uVar8 = uVar8 + 1 & uVar1 - 1;
        pBVar9 = pBVar9 + 1;
      } while (uVar8 != sVar2);
    }
    pBVar5->size = uVar1 * 2;
    (pBVar5->front).super___atomic_base<unsigned_long>._M_i = numberOfFilledSlotsToExpose - 1;
    pBVar5->entries = pBVar6;
    pBVar5->prev = this->pr_blockIndexRaw;
    this->pr_blockIndexFront = sVar7;
    this->pr_blockIndexEntries = pBVar6;
    this->pr_blockIndexRaw = pBVar5;
    (this->blockIndex)._M_b._M_p = pBVar5;
  }
  return pBVar5 != (__pointer_type)0x0;
}

Assistant:

bool new_block_index(size_t numberOfFilledSlotsToExpose)
		{
			auto prevBlockSizeMask = pr_blockIndexSize - 1;
			
			// Create the new block
			pr_blockIndexSize <<= 1;
			auto newRawPtr = static_cast<char*>((Traits::malloc)(sizeof(BlockIndexHeader) + std::alignment_of<BlockIndexEntry>::value - 1 + sizeof(BlockIndexEntry) * pr_blockIndexSize));
			if (newRawPtr == nullptr) {
				pr_blockIndexSize >>= 1;		// Reset to allow graceful retry
				return false;
			}
			
			auto newBlockIndexEntries = reinterpret_cast<BlockIndexEntry*>(details::align_for<BlockIndexEntry>(newRawPtr + sizeof(BlockIndexHeader)));
			
			// Copy in all the old indices, if any
			size_t j = 0;
			if (pr_blockIndexSlotsUsed != 0) {
				auto i = (pr_blockIndexFront - pr_blockIndexSlotsUsed) & prevBlockSizeMask;
				do {
					newBlockIndexEntries[j++] = pr_blockIndexEntries[i];
					i = (i + 1) & prevBlockSizeMask;
				} while (i != pr_blockIndexFront);
			}
			
			// Update everything
			auto header = new (newRawPtr) BlockIndexHeader;
			header->size = pr_blockIndexSize;
			header->front.store(numberOfFilledSlotsToExpose - 1, std::memory_order_relaxed);
			header->entries = newBlockIndexEntries;
			header->prev = pr_blockIndexRaw;		// we link the new block to the old one so we can free it later
			
			pr_blockIndexFront = j;
			pr_blockIndexEntries = newBlockIndexEntries;
			pr_blockIndexRaw = newRawPtr;
			blockIndex.store(header, std::memory_order_release);
			
			return true;
		}